

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_iarchive.h
# Opt level: O0

size_type __thiscall serialization::xml_iarchive::load_sequence_start(xml_iarchive *this)

{
  reference ppxVar1;
  char *pcVar2;
  ulonglong uVar3;
  char *pcVar4;
  size_t sVar5;
  xml_node<char> *local_58;
  char *pcStack_30;
  size_type size;
  char *end;
  xml_attribute<char> *attr;
  xml_node<char> *node;
  xml_iarchive *pxStack_10;
  serialization_trace trace;
  xml_iarchive *this_local;
  
  pxStack_10 = this;
  serialization_trace::serialization_trace<char_const(&)[20],char_const(&)[4]>
            ((serialization_trace *)((long)&node + 7),(char (*) [20])"load_sequence_start",
             (char (*) [4])"xml");
  ppxVar1 = std::
            stack<const_rapidxml::xml_node<char>_*,_std::deque<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>_>
            ::top(&this->stack_);
  attr = (xml_attribute<char> *)rapidxml::xml_node<char>::first_node(*ppxVar1,"sequence",0,true);
  if ((xml_node<char> *)attr == (xml_node<char> *)0x0) {
    throw_serialization_error("load_sequence_start","expect sequence");
  }
  end = (char *)rapidxml::xml_node<char>::first_attribute((xml_node<char> *)attr,"size",0,true);
  if ((xml_attribute<char> *)end == (xml_attribute<char> *)0x0) {
    throw_serialization_error("load_sequence_start","expect sequence size");
  }
  pcStack_30 = rapidxml::xml_base<char>::value((xml_base<char> *)end);
  pcVar2 = rapidxml::xml_base<char>::value((xml_base<char> *)end);
  uVar3 = strtoull(pcVar2,&stack0xffffffffffffffd0,10);
  pcVar2 = pcStack_30;
  pcVar4 = rapidxml::xml_base<char>::value((xml_base<char> *)end);
  sVar5 = rapidxml::xml_base<char>::value_size((xml_base<char> *)end);
  if ((long)pcVar2 - (long)pcVar4 != sVar5) {
    throw_serialization_error("load_sequence_start","bad sequence size");
  }
  std::
  stack<const_rapidxml::xml_node<char>_*,_std::deque<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>_>
  ::push(&this->stack_,(value_type *)&attr);
  if ((size_type)uVar3 == 0) {
    local_58 = (xml_node<char> *)0x0;
  }
  else {
    ppxVar1 = std::
              stack<const_rapidxml::xml_node<char>_*,_std::deque<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>_>
              ::top(&this->stack_);
    local_58 = rapidxml::xml_node<char>::first_node(*ppxVar1,"item",0,true);
  }
  attr = (xml_attribute<char> *)local_58;
  std::
  stack<const_rapidxml::xml_node<char>_*,_std::deque<const_rapidxml::xml_node<char>_*,_std::allocator<const_rapidxml::xml_node<char>_*>_>_>
  ::push(&this->stack_,(value_type *)&attr);
  return (size_type)uVar3;
}

Assistant:

size_type load_sequence_start() const
    {
        serialization_trace trace(__func__, "xml");
        auto node = stack_.top()->first_node("sequence");
        if(node == nullptr)
        {
            throw_serialization_error(__func__, "expect sequence");
        }
        auto attr = node->first_attribute("size");
        if(attr == nullptr)
        {
            throw_serialization_error(__func__, "expect sequence size");
        }

        char *end = attr->value();
        size_type size = std::strtoull(attr->value(), &end, 10);
        if(end - attr->value() != attr->value_size())
        {
            throw_serialization_error(__func__, "bad sequence size");
        }

        stack_.push(node);
        node = (size == 0 ? nullptr : stack_.top()->first_node("item"));
        stack_.push(node);

        return size;
    }